

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteDTDExternalEntity
              (xmlTextWriterPtr writer,int pe,xmlChar *name,xmlChar *pubid,xmlChar *sysid,
              xmlChar *ndataid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int sum;
  int count;
  xmlChar *ndataid_local;
  xmlChar *sysid_local;
  xmlChar *pubid_local;
  xmlChar *name_local;
  int pe_local;
  xmlTextWriterPtr writer_local;
  
  if ((pubid == (xmlChar *)0x0) && (sysid == (xmlChar *)0x0)) {
    writer_local._4_4_ = -1;
  }
  else if ((pe == 0) || (ndataid == (xmlChar *)0x0)) {
    iVar1 = xmlTextWriterStartDTDEntity(writer,pe,name);
    if (iVar1 == -1) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar2 = xmlTextWriterWriteDTDExternalEntityContents(writer,pubid,sysid,ndataid);
      if (iVar2 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        iVar3 = xmlTextWriterEndDTDEntity(writer);
        if (iVar3 == -1) {
          writer_local._4_4_ = -1;
        }
        else {
          writer_local._4_4_ = iVar3 + iVar2 + iVar1;
        }
      }
    }
  }
  else {
    writer_local._4_4_ = -1;
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteDTDExternalEntity(xmlTextWriterPtr writer,
                                    int pe,
                                    const xmlChar * name,
                                    const xmlChar * pubid,
                                    const xmlChar * sysid,
                                    const xmlChar * ndataid)
{
    int count;
    int sum;

    if (((pubid == NULL) && (sysid == NULL)))
        return -1;
    if ((pe != 0) && (ndataid != NULL))
        return -1;

    sum = 0;
    count = xmlTextWriterStartDTDEntity(writer, pe, name);
    if (count == -1)
        return -1;
    sum += count;

    count =
        xmlTextWriterWriteDTDExternalEntityContents(writer, pubid, sysid,
                                                    ndataid);
    if (count < 0)
        return -1;
    sum += count;

    count = xmlTextWriterEndDTDEntity(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}